

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int close_filters(archive_read *a)

{
  archive_read_filter *paVar1;
  int iVar2;
  int r1;
  archive_read_filter *t;
  archive_read_filter *paStack_18;
  int r;
  archive_read_filter *f;
  archive_read *a_local;
  
  t._4_4_ = 0;
  paStack_18 = a->filter;
  while (paStack_18 != (archive_read_filter *)0x0) {
    paVar1 = paStack_18->upstream;
    if ((paStack_18->closed == '\0') && (paStack_18->vtable != (archive_read_filter_vtable *)0x0)) {
      iVar2 = (*paStack_18->vtable->close)(paStack_18);
      paStack_18->closed = '\x01';
      if (iVar2 < t._4_4_) {
        t._4_4_ = iVar2;
      }
    }
    free(paStack_18->buffer);
    paStack_18->buffer = (char *)0x0;
    paStack_18 = paVar1;
  }
  return t._4_4_;
}

Assistant:

static int
close_filters(struct archive_read *a)
{
	struct archive_read_filter *f = a->filter;
	int r = ARCHIVE_OK;
	/* Close each filter in the pipeline. */
	while (f != NULL) {
		struct archive_read_filter *t = f->upstream;
		if (!f->closed && f->vtable != NULL) {
			int r1 = (f->vtable->close)(f);
			f->closed = 1;
			if (r1 < r)
				r = r1;
		}
		free(f->buffer);
		f->buffer = NULL;
		f = t;
	}
	return r;
}